

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>
          (Node *this,long value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more,char *more_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  char *more_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local;
  long value_local;
  Node *this_local;
  
  local_28 = more_1;
  more_local_1 = (char *)more;
  more_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value;
  value_local = (long)this;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<long&>((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
                       *)&this->properties,(long *)&more_local);
  std::__cxx11::string::string((string *)&local_48,(string *)more);
  AddProperties<std::__cxx11::string,char_const*>(this,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }